

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgb findNearestColor(QRgb color,QRasterBuffer *rbuf)

{
  QRgb rgb;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_RSI;
  QRgb in_EDI;
  int dist_1;
  int dist_0;
  int bx;
  int gx;
  int rx;
  int b;
  int g;
  int r;
  QRgb color_1;
  QRgb color_0;
  QRgb local_4;
  
  rgb = *(QRgb *)(in_RSI + 4);
  local_4 = *(QRgb *)(in_RSI + 8);
  iVar1 = qRed(in_EDI);
  iVar2 = qGreen(in_EDI);
  iVar3 = qBlue(in_EDI);
  iVar4 = qRed(rgb);
  iVar5 = qGreen(rgb);
  iVar6 = qBlue(rgb);
  iVar7 = qRed(local_4);
  iVar8 = qGreen(local_4);
  iVar9 = qBlue(local_4);
  if ((iVar1 - iVar4) * (iVar1 - iVar4) + (iVar2 - iVar5) * (iVar2 - iVar5) +
      (iVar3 - iVar6) * (iVar3 - iVar6) <
      (iVar1 - iVar7) * (iVar1 - iVar7) + (iVar2 - iVar8) * (iVar2 - iVar8) +
      (iVar3 - iVar9) * (iVar3 - iVar9)) {
    local_4 = rgb;
  }
  return local_4;
}

Assistant:

static inline QRgb findNearestColor(QRgb color, QRasterBuffer *rbuf)
{
    const QRgb color_0 = rbuf->destColor0;
    const QRgb color_1 = rbuf->destColor1;

    int r = qRed(color);
    int g = qGreen(color);
    int b = qBlue(color);
    int rx, gx, bx;
    int dist_0, dist_1;

    rx = r - qRed(color_0);
    gx = g - qGreen(color_0);
    bx = b - qBlue(color_0);
    dist_0 = rx*rx + gx*gx + bx*bx;

    rx = r - qRed(color_1);
    gx = g - qGreen(color_1);
    bx = b - qBlue(color_1);
    dist_1 = rx*rx + gx*gx + bx*bx;

    if (dist_0 < dist_1)
        return color_0;
    return color_1;
}